

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_all_tile_parts
                   (opj_j2k_t *p_j2k,OPJ_BYTE *p_data,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_total_data_size,opj_stream_private_t *p_stream,
                   opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_tcd_t *p_tile_coder;
  opj_tcp_t *poVar2;
  OPJ_UINT32 *pOVar3;
  OPJ_UINT32 OVar4;
  OPJ_BOOL OVar5;
  OPJ_UINT32 OVar6;
  opj_cp_t *cp;
  opj_cp_t *l_cp;
  opj_tcd_t *l_tcd;
  opj_tcp_t *l_tcp;
  OPJ_BYTE *l_begin_data;
  OPJ_UINT32 pino;
  OPJ_UINT32 tot_num_tp;
  OPJ_UINT32 l_part_tile_size;
  OPJ_UINT32 l_current_nb_bytes_written;
  OPJ_UINT32 l_nb_bytes_written;
  OPJ_UINT32 tilepartno;
  opj_event_mgr *p_manager_local;
  opj_stream_private_t *p_stream_local;
  OPJ_UINT32 *pOStack_28;
  OPJ_UINT32 p_total_data_size_local;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *p_data_local;
  opj_j2k_t *p_j2k_local;
  
  l_current_nb_bytes_written = 0;
  l_part_tile_size = 0;
  p_tile_coder = p_j2k->m_tcd;
  cp = &p_j2k->m_cp;
  poVar2 = (p_j2k->m_cp).tcps;
  uVar1 = p_j2k->m_current_tile_number;
  _l_nb_bytes_written = p_manager;
  p_manager_local = (opj_event_mgr *)p_stream;
  p_stream_local._4_4_ = p_total_data_size;
  pOStack_28 = p_data_written;
  p_data_written_local = (OPJ_UINT32 *)p_data;
  p_data_local = (OPJ_BYTE *)p_j2k;
  OVar4 = opj_j2k_get_num_tp(cp,0,p_j2k->m_current_tile_number);
  *(int *)(p_data_local + 0xc) = *(int *)(p_data_local + 0xc) + 1;
  l_current_nb_bytes_written = 1;
  while( true ) {
    pOVar3 = p_data_written_local;
    if (OVar4 <= l_current_nb_bytes_written) {
      l_begin_data._0_4_ = 1;
      do {
        if (poVar2[uVar1].numpocs < (uint)l_begin_data) {
          *pOStack_28 = l_part_tile_size;
          return 1;
        }
        p_tile_coder->cur_pino = (uint)l_begin_data;
        OVar4 = opj_j2k_get_num_tp(cp,(uint)l_begin_data,*(OPJ_UINT32 *)(p_data_local + 0x120));
        for (l_current_nb_bytes_written = 0; pOVar3 = p_data_written_local,
            l_current_nb_bytes_written < OVar4;
            l_current_nb_bytes_written = l_current_nb_bytes_written + 1) {
          *(OPJ_UINT32 *)(p_data_local + 8) = l_current_nb_bytes_written;
          tot_num_tp = 0;
          OVar5 = opj_j2k_write_sot((opj_j2k_t *)p_data_local,(OPJ_BYTE *)p_data_written_local,
                                    p_stream_local._4_4_,&tot_num_tp,
                                    (opj_stream_private_t *)p_manager_local,_l_nb_bytes_written);
          OVar6 = tot_num_tp;
          if (OVar5 == 0) {
            return 0;
          }
          l_part_tile_size = tot_num_tp + l_part_tile_size;
          p_data_written_local = (OPJ_UINT32 *)((long)p_data_written_local + (ulong)tot_num_tp);
          p_stream_local._4_4_ = p_stream_local._4_4_ - tot_num_tp;
          tot_num_tp = 0;
          OVar5 = opj_j2k_write_sod((opj_j2k_t *)p_data_local,p_tile_coder,
                                    (OPJ_BYTE *)p_data_written_local,&tot_num_tp,
                                    p_stream_local._4_4_,(opj_stream_private_t *)p_manager_local,
                                    _l_nb_bytes_written);
          if (OVar5 == 0) {
            return 0;
          }
          l_part_tile_size = tot_num_tp + l_part_tile_size;
          p_data_written_local = (OPJ_UINT32 *)((long)p_data_written_local + (ulong)tot_num_tp);
          p_stream_local._4_4_ = p_stream_local._4_4_ - tot_num_tp;
          OVar6 = tot_num_tp + OVar6;
          opj_write_bytes_LE((OPJ_BYTE *)((long)pOVar3 + 6),OVar6,4);
          if ((2 < cp->rsiz) && (cp->rsiz < 7)) {
            opj_j2k_update_tlm((opj_j2k_t *)p_data_local,OVar6);
          }
          *(int *)(p_data_local + 0xc) = *(int *)(p_data_local + 0xc) + 1;
        }
        l_begin_data._0_4_ = (uint)l_begin_data + 1;
      } while( true );
    }
    *(OPJ_UINT32 *)(p_data_local + 8) = l_current_nb_bytes_written;
    tot_num_tp = 0;
    OVar5 = opj_j2k_write_sot((opj_j2k_t *)p_data_local,(OPJ_BYTE *)p_data_written_local,
                              p_stream_local._4_4_,&tot_num_tp,
                              (opj_stream_private_t *)p_manager_local,_l_nb_bytes_written);
    OVar6 = tot_num_tp;
    if (OVar5 == 0) {
      return 0;
    }
    l_part_tile_size = tot_num_tp + l_part_tile_size;
    p_data_written_local = (OPJ_UINT32 *)((long)p_data_written_local + (ulong)tot_num_tp);
    p_stream_local._4_4_ = p_stream_local._4_4_ - tot_num_tp;
    tot_num_tp = 0;
    OVar5 = opj_j2k_write_sod((opj_j2k_t *)p_data_local,p_tile_coder,
                              (OPJ_BYTE *)p_data_written_local,&tot_num_tp,p_stream_local._4_4_,
                              (opj_stream_private_t *)p_manager_local,_l_nb_bytes_written);
    if (OVar5 == 0) break;
    p_data_written_local = (OPJ_UINT32 *)((long)p_data_written_local + (ulong)tot_num_tp);
    l_part_tile_size = tot_num_tp + l_part_tile_size;
    p_stream_local._4_4_ = p_stream_local._4_4_ - tot_num_tp;
    OVar6 = tot_num_tp + OVar6;
    opj_write_bytes_LE((OPJ_BYTE *)((long)pOVar3 + 6),OVar6,4);
    if ((2 < cp->rsiz) && (cp->rsiz < 7)) {
      opj_j2k_update_tlm((opj_j2k_t *)p_data_local,OVar6);
    }
    *(int *)(p_data_local + 0xc) = *(int *)(p_data_local + 0xc) + 1;
    l_current_nb_bytes_written = l_current_nb_bytes_written + 1;
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_all_tile_parts(opj_j2k_t *p_j2k,
        OPJ_BYTE * p_data,
        OPJ_UINT32 * p_data_written,
        OPJ_UINT32 p_total_data_size,
        opj_stream_private_t *p_stream,
        struct opj_event_mgr * p_manager
                                            )
{
    OPJ_UINT32 tilepartno = 0;
    OPJ_UINT32 l_nb_bytes_written = 0;
    OPJ_UINT32 l_current_nb_bytes_written;
    OPJ_UINT32 l_part_tile_size;
    OPJ_UINT32 tot_num_tp;
    OPJ_UINT32 pino;

    OPJ_BYTE * l_begin_data;
    opj_tcp_t *l_tcp = 00;
    opj_tcd_t * l_tcd = 00;
    opj_cp_t * l_cp = 00;

    l_tcd = p_j2k->m_tcd;
    l_cp = &(p_j2k->m_cp);
    l_tcp = l_cp->tcps + p_j2k->m_current_tile_number;

    /*Get number of tile parts*/
    tot_num_tp = opj_j2k_get_num_tp(l_cp, 0, p_j2k->m_current_tile_number);

    /* start writing remaining tile parts */
    ++p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;
    for (tilepartno = 1; tilepartno < tot_num_tp ; ++tilepartno) {
        p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number = tilepartno;
        l_current_nb_bytes_written = 0;
        l_part_tile_size = 0;
        l_begin_data = p_data;

        if (! opj_j2k_write_sot(p_j2k, p_data,
                                p_total_data_size,
                                &l_current_nb_bytes_written,
                                p_stream,
                                p_manager)) {
            return OPJ_FALSE;
        }

        l_nb_bytes_written += l_current_nb_bytes_written;
        p_data += l_current_nb_bytes_written;
        p_total_data_size -= l_current_nb_bytes_written;
        l_part_tile_size += l_current_nb_bytes_written;

        l_current_nb_bytes_written = 0;
        if (! opj_j2k_write_sod(p_j2k, l_tcd, p_data, &l_current_nb_bytes_written,
                                p_total_data_size, p_stream, p_manager)) {
            return OPJ_FALSE;
        }

        p_data += l_current_nb_bytes_written;
        l_nb_bytes_written += l_current_nb_bytes_written;
        p_total_data_size -= l_current_nb_bytes_written;
        l_part_tile_size += l_current_nb_bytes_written;

        /* Writing Psot in SOT marker */
        opj_write_bytes(l_begin_data + 6, l_part_tile_size,
                        4);                                   /* PSOT */

        if (OPJ_IS_CINEMA(l_cp->rsiz)) {
            opj_j2k_update_tlm(p_j2k, l_part_tile_size);
        }

        ++p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;
    }

    for (pino = 1; pino <= l_tcp->numpocs; ++pino) {
        l_tcd->cur_pino = pino;

        /*Get number of tile parts*/
        tot_num_tp = opj_j2k_get_num_tp(l_cp, pino, p_j2k->m_current_tile_number);
        for (tilepartno = 0; tilepartno < tot_num_tp ; ++tilepartno) {
            p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number = tilepartno;
            l_current_nb_bytes_written = 0;
            l_part_tile_size = 0;
            l_begin_data = p_data;

            if (! opj_j2k_write_sot(p_j2k, p_data,
                                    p_total_data_size,
                                    &l_current_nb_bytes_written, p_stream,
                                    p_manager)) {
                return OPJ_FALSE;
            }

            l_nb_bytes_written += l_current_nb_bytes_written;
            p_data += l_current_nb_bytes_written;
            p_total_data_size -= l_current_nb_bytes_written;
            l_part_tile_size += l_current_nb_bytes_written;

            l_current_nb_bytes_written = 0;

            if (! opj_j2k_write_sod(p_j2k, l_tcd, p_data, &l_current_nb_bytes_written,
                                    p_total_data_size, p_stream, p_manager)) {
                return OPJ_FALSE;
            }

            l_nb_bytes_written += l_current_nb_bytes_written;
            p_data += l_current_nb_bytes_written;
            p_total_data_size -= l_current_nb_bytes_written;
            l_part_tile_size += l_current_nb_bytes_written;

            /* Writing Psot in SOT marker */
            opj_write_bytes(l_begin_data + 6, l_part_tile_size,
                            4);                                   /* PSOT */

            if (OPJ_IS_CINEMA(l_cp->rsiz)) {
                opj_j2k_update_tlm(p_j2k, l_part_tile_size);
            }

            ++p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;
        }
    }

    *p_data_written = l_nb_bytes_written;

    return OPJ_TRUE;
}